

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::GaugeTest_inc_number_Test::TestBody(GaugeTest_inc_number_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  Gauge gauge;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  undefined8 *local_18;
  Gauge local_10;
  
  local_10.value_._M_i = (atomic<double>)0.0;
  Gauge::Increment(&local_10,4.0);
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Gauge::Value(&local_10);
  local_28.data_ = (AssertHelperData *)0x4010000000000000;
  testing::internal::CmpHelperEQ<double,double>
            (local_20,"gauge.Value()","4.0",(double *)&local_30,(double *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/gauge_test.cc"
               ,0x16,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

TEST(GaugeTest, inc_number) {
  Gauge gauge;
  gauge.Increment(4);
  EXPECT_EQ(gauge.Value(), 4.0);
}